

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O3

PVG_FT_Outline * ft_outline_create(int points,int contours)

{
  PVG_FT_Outline *pPVar1;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  
  lVar2 = (long)(points + contours);
  uVar3 = lVar2 + 7U & 0xfffffffffffffff8;
  uVar5 = (long)contours * 4 + 7U & 0xfffffffffffffff8;
  pPVar1 = (PVG_FT_Outline *)
           malloc(uVar5 + ((long)contours + 7U & 0xfffffffffffffff8) + lVar2 * 0x10 + uVar3 + 0x30);
  pPVar1->points = (PVG_FT_Vector *)(pPVar1 + 1);
  pPVar1->tags = (char *)(&pPVar1[1].n_contours + lVar2 * 4);
  piVar4 = (int *)((long)(&pPVar1[1].n_contours + lVar2 * 4) + uVar3);
  pPVar1->contours = piVar4;
  pPVar1->contours_flag = (char *)((long)piVar4 + uVar5);
  pPVar1->n_contours = 0;
  pPVar1->n_points = 0;
  pPVar1->flags = 0;
  return pPVar1;
}

Assistant:

static PVG_FT_Outline* ft_outline_create(int points, int contours)
{
    size_t points_size = ALIGN_SIZE((points + contours) * sizeof(PVG_FT_Vector));
    size_t tags_size = ALIGN_SIZE((points + contours) * sizeof(char));
    size_t contours_size = ALIGN_SIZE(contours * sizeof(int));
    size_t contours_flag_size = ALIGN_SIZE(contours * sizeof(char));
    PVG_FT_Outline* outline = malloc(points_size + tags_size + contours_size + contours_flag_size + sizeof(PVG_FT_Outline));

    PVG_FT_Byte* outline_data = (PVG_FT_Byte*)(outline + 1);
    outline->points = (PVG_FT_Vector*)(outline_data);
    outline->tags = (char*)(outline_data + points_size);
    outline->contours = (int*)(outline_data + points_size + tags_size);
    outline->contours_flag = (char*)(outline_data + points_size + tags_size + contours_size);
    outline->n_points = 0;
    outline->n_contours = 0;
    outline->flags = 0x0;
    return outline;
}